

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O3

void __thiscall HVectorBase<HighsCDouble>::clear(HVectorBase<HighsCDouble> *this)

{
  int *piVar1;
  pointer pHVar2;
  int iVar3;
  pointer piVar4;
  pointer pHVar5;
  long lVar6;
  value_type local_18;
  
  iVar3 = this->count;
  if (((long)iVar3 < 0) || ((double)this->size * 0.3 < (double)iVar3)) {
    local_18.hi = 0.0;
    local_18.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&this->array,(long)this->size,&local_18);
  }
  else if (iVar3 != 0) {
    piVar4 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar5 = (this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      piVar1 = piVar4 + lVar6;
      lVar6 = lVar6 + 1;
      pHVar2 = pHVar5 + *piVar1;
      pHVar2->hi = 0.0;
      pHVar2->lo = 0.0;
    } while (iVar3 != lVar6);
  }
  this->packFlag = false;
  this->count = 0;
  this->synthetic_tick = 0.0;
  this->next = (HVectorBase<HighsCDouble> *)0x0;
  return;
}

Assistant:

void HVectorBase<Real>::clear() {
  /*
   * Clear an HVector instance
   */
  // Standard HVector to clear
  HighsInt dense_clear = count < 0 || count > size * 0.3;
  if (dense_clear) {
    // Treat the array as full if there are no indices or too many
    // indices
    array.assign(size, Real{0});
  } else {
    // Zero according to the indices of (possible) nonzeros
    for (HighsInt i = 0; i < count; i++) {
      array[index[i]] = 0;
    }
  }
  this->clearScalars();
}